

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_strings.cpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::string_mapping::add_string
          (string_mapping *this,not_null<transaction_base_*> transaction,string *str)

{
  _List_node_base *p_Var1;
  uint uVar2;
  error_category *peVar3;
  error_code eVar4;
  size_type local_148;
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  names_index;
  not_null<const_pstore::sstring_view<const_char_*>_*> local_128;
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  add_res;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->strings_,str);
  p_Var1 = (this->strings_).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  add_res.first.it_.db_ = (database_reference)p_Var1[1]._M_next;
  add_res.first.it_.visited_parents_.c_._M_elems[0].node = (index_pointer)p_Var1[1]._M_prev;
  std::__cxx11::
  list<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>::
  emplace_back<pstore::sstring_view<char_const*>>
            ((list<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>
              *)&this->views_,(sstring_view<const_char_*> *)&add_res);
  p_Var1 = (this->views_).
           super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  index::
  get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((index *)&names_index,(transaction.ptr_)->db_,true);
  local_128.ptr_ = (sstring_view<const_char_*> *)(p_Var1 + 1);
  gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::ensure_invariant(&local_128);
  indirect_string_adder::
  add<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            (&add_res,&this->adder_,transaction.ptr_,&names_index,local_128);
  if (add_res.second == false) {
    eVar4 = make_error_code(duplicate_name);
    peVar3 = eVar4._M_cat;
    uVar2 = eVar4._M_value;
  }
  else {
    local_148 = (this->lookup_)._M_h._M_element_count;
    index::
    hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
    ::iterator_base<true>::get_address((iterator_base<true> *)&add_res);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,pstore::typed_address<pstore::indirect_string>>,std::allocator<std::pair<unsigned_long_const,pstore::typed_address<pstore::indirect_string>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_long,pstore::typed_address<pstore::indirect_string>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,pstore::typed_address<pstore::indirect_string>>,std::allocator<std::pair<unsigned_long_const,pstore::typed_address<pstore::indirect_string>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->lookup_,&local_148);
    uVar2 = 0;
    peVar3 = (error_category *)std::_V2::system_category();
  }
  std::
  unique_ptr<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
  ::~unique_ptr(&add_res.first.it_.pos_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&names_index.
              super___shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  eVar4._4_4_ = 0;
  eVar4._M_value = uVar2;
  eVar4._M_cat = peVar3;
  return eVar4;
}

Assistant:

std::error_code
            string_mapping::add_string (not_null<transaction_base *> const transaction,
                                        std::string const & str) {
                strings_.push_back (str);
                std::string const & x = strings_.back ();

                views_.emplace_back (make_sstring_view (x));
                auto & s = views_.back ();

                std::shared_ptr<index::name_index> const names_index =
                    index::get_index<trailer::indices::name> (transaction->db ());
                std::pair<index::name_index::iterator, bool> const add_res =
                    adder_.add (*transaction, names_index, &s);
                if (!add_res.second) {
                    return error::duplicate_name;
                }

                lookup_.emplace (lookup_.size (), typed_address<indirect_string>::make (
                                                      add_res.first.get_address ()));
                return {};
            }